

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,unsigned_long>,std::hash<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::shared_ptr<vmips::VirtReg>const&>,std::tuple<>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,unsigned_long>,std::hash<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
           *this,size_t i,piecewise_construct_t *args,
          tuple<const_std::shared_ptr<vmips::VirtReg>_&> *args_1,tuple<> *args_2)

{
  undefined8 *puVar1;
  key_arg<std::shared_ptr<vmips::VirtReg>_> *key;
  shared_ptr<vmips::VirtReg> *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 auVar4 [16];
  iterator iVar5;
  
  puVar1 = (undefined8 *)(*(long *)(this + 8) + i * 0x18);
  psVar2 = (args_1->super__Tuple_impl<0UL,_const_std::shared_ptr<vmips::VirtReg>_&>).
           super__Head_base<0UL,_const_std::shared_ptr<vmips::VirtReg>_&,_false>._M_head_impl;
  *puVar1 = (psVar2->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (psVar2->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  puVar1[1] = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  puVar1[2] = 0;
  key = (key_arg<std::shared_ptr<vmips::VirtReg>_> *)(*(long *)(this + 8) + i * 0x18);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (key->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar5 = find<std::shared_ptr<vmips::VirtReg>>
                    (this,key,SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,8) +
                              SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,0));
  if (iVar5.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x825,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>, unsigned long>, std::hash<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::pair<const std::shared_ptr<vmips::VirtReg>, unsigned long>>>::emplace_at(size_t, Args &&...) [Policy = phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>, unsigned long>, Hash = std::hash<std::shared_ptr<vmips::VirtReg>>, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::pair<const std::shared_ptr<vmips::VirtReg>, unsigned long>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::shared_ptr<vmips::VirtReg> &>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }